

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O1

void __thiscall FileHandlePool::returnResourceToPool(FileHandlePool *this,int index)

{
  atomic<bool> *paVar1;
  pointer *__mutex;
  pointer ppPVar2;
  PoolEntry *pPVar3;
  _func_int *p_Var4;
  int iVar5;
  fdb_status fVar6;
  ts_nsec start;
  ts_nsec end;
  uint64_t diff;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  fdb_kvs_handle *pfStack_38;
  
  ppPVar2 = (this->pool_vector).super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->pool_vector).
                    super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppPVar2 >> 3) <= (ulong)(long)index) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  pPVar3 = ppPVar2[index];
  if (pPVar3 == (PoolEntry *)0x0) {
    returnResourceToPool();
  }
  else {
    paVar1 = &pPVar3->available;
    LOCK();
    bVar9 = (paVar1->_M_base)._M_i == false;
    if (bVar9) {
      (paVar1->_M_base)._M_i = true;
    }
    UNLOCK();
    if (!bVar9) {
      returnResourceToPool();
      pfStack_38 = (fdb_kvs_handle *)0x0;
      __mutex = &this[1].pool_vector.super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      iVar5 = rand();
      uVar7 = (long)this[1].pool_vector.
                    super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>._M_impl.
                    super__Vector_impl_data._M_start - (long)this[1]._vptr_FileHandlePool >> 3;
      uVar8 = (ulong)(int)((ulong)(long)iVar5 % uVar7);
      if (uVar7 <= uVar8) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8
                   ,uVar7);
      }
      p_Var4 = this[1]._vptr_FileHandlePool[uVar8];
      if (p_Var4 != (_func_int *)0x0) {
        start = get_monotonic_ts();
        fVar6 = fdb_snapshot_open(*(fdb_kvs_handle **)(p_Var4 + 0x10),&pfStack_38,0xffffffffffffffff
                                 );
        end = get_monotonic_ts();
        if (fVar6 != FDB_RESULT_SUCCESS) {
          fdb_assert_die("status == FDB_RESULT_SUCCESS",
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                         ,0x145,(long)fVar6,0);
        }
        diff = ts_diff(start,end);
        collectStat(this,4,diff);
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
  }
  return;
}

Assistant:

void returnResourceToPool(int index) {
        PoolEntry *pe = pool_vector.at(index);
        if (!pe) {
            fprintf(stderr, "Invalid entry!\n");
            return;
        }
        bool inverse = false;
        if (!pe->available.compare_exchange_strong(inverse, true)) {
            fprintf(stderr, "Handles were likely used by another thread!");
            assert(false);
        }
    }